

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_1_5.cpp
# Opt level: O1

bool __thiscall QOpenGLFunctions_1_5::initializeOpenGLFunctions(QOpenGLFunctions_1_5 *this)

{
  QAtomicInt *pQVar1;
  bool bVar2;
  QOpenGLContext *context;
  QOpenGLContext *pQVar3;
  QOpenGLFunctions_1_0_CoreBackend *pQVar4;
  QOpenGLFunctions_1_1_CoreBackend *pQVar5;
  QOpenGLFunctions_1_2_CoreBackend *pQVar6;
  QOpenGLFunctions_1_3_CoreBackend *pQVar7;
  QOpenGLFunctions_1_4_CoreBackend *pQVar8;
  QOpenGLFunctions_1_5_CoreBackend *pQVar9;
  QOpenGLFunctions_1_0_DeprecatedBackend *pQVar10;
  QOpenGLFunctions_1_1_DeprecatedBackend *pQVar11;
  QOpenGLFunctions_1_2_DeprecatedBackend *pQVar12;
  QOpenGLFunctions_1_3_DeprecatedBackend *pQVar13;
  QOpenGLFunctions_1_4_DeprecatedBackend *pQVar14;
  
  bVar2 = QAbstractOpenGLFunctions::isInitialized(&this->super_QAbstractOpenGLFunctions);
  if (bVar2) {
    return true;
  }
  context = (QOpenGLContext *)QOpenGLContext::currentContext();
  pQVar3 = QAbstractOpenGLFunctions::owningContext(&this->super_QAbstractOpenGLFunctions);
  if (pQVar3 == (QOpenGLContext *)0x0) {
LAB_0016daaa:
    pQVar3 = QAbstractOpenGLFunctions::owningContext(&this->super_QAbstractOpenGLFunctions);
    if (pQVar3 != (QOpenGLContext *)0x0) goto LAB_0016dbb7;
  }
  else {
    pQVar3 = QAbstractOpenGLFunctions::owningContext(&this->super_QAbstractOpenGLFunctions);
    if (pQVar3 != context) goto LAB_0016daaa;
  }
  bVar2 = isContextCompatible(context);
  if (bVar2) {
    pQVar4 = (QOpenGLFunctions_1_0_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_0_Core);
    this->d_1_0_Core = pQVar4;
    LOCK();
    pQVar1 = &(pQVar4->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar5 = (QOpenGLFunctions_1_1_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_1_Core);
    this->d_1_1_Core = pQVar5;
    LOCK();
    pQVar1 = &(pQVar5->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar6 = (QOpenGLFunctions_1_2_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_2_Core);
    this->d_1_2_Core = pQVar6;
    LOCK();
    pQVar1 = &(pQVar6->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar7 = (QOpenGLFunctions_1_3_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_3_Core);
    this->d_1_3_Core = pQVar7;
    LOCK();
    pQVar1 = &(pQVar7->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar8 = (QOpenGLFunctions_1_4_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_4_Core);
    this->d_1_4_Core = pQVar8;
    LOCK();
    pQVar1 = &(pQVar8->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar9 = (QOpenGLFunctions_1_5_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_5_Core);
    this->d_1_5_Core = pQVar9;
    LOCK();
    pQVar1 = &(pQVar9->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar10 = (QOpenGLFunctions_1_0_DeprecatedBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_0_Deprecated);
    this->d_1_0_Deprecated = pQVar10;
    LOCK();
    pQVar1 = &(pQVar10->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar11 = (QOpenGLFunctions_1_1_DeprecatedBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_1_Deprecated);
    this->d_1_1_Deprecated = pQVar11;
    LOCK();
    pQVar1 = &(pQVar11->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar12 = (QOpenGLFunctions_1_2_DeprecatedBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_2_Deprecated);
    this->d_1_2_Deprecated = pQVar12;
    LOCK();
    pQVar1 = &(pQVar12->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar13 = (QOpenGLFunctions_1_3_DeprecatedBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_3_Deprecated);
    this->d_1_3_Deprecated = pQVar13;
    LOCK();
    pQVar1 = &(pQVar13->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar14 = (QOpenGLFunctions_1_4_DeprecatedBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_4_Deprecated);
    this->d_1_4_Deprecated = pQVar14;
    LOCK();
    pQVar1 = &(pQVar14->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    QAbstractOpenGLFunctions::initializeOpenGLFunctions(&this->super_QAbstractOpenGLFunctions);
  }
LAB_0016dbb7:
  bVar2 = QAbstractOpenGLFunctions::isInitialized(&this->super_QAbstractOpenGLFunctions);
  return bVar2;
}

Assistant:

bool QOpenGLFunctions_1_5::initializeOpenGLFunctions()
{
    if ( isInitialized() )
        return true;

    QOpenGLContext* context = QOpenGLContext::currentContext();

    // If owned by a context object make sure it is current.
    // Also check that current context is capable of resolving all needed functions
    if (((owningContext() && owningContext() == context) || !owningContext())
        && QOpenGLFunctions_1_5::isContextCompatible(context))
    {
        // Associate with private implementation, creating if necessary
        // Function pointers in the backends are resolved at creation time
        QOpenGLVersionFunctionsBackend* d = nullptr;
        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_0_CoreBackend::versionStatus());
        d_1_0_Core = static_cast<QOpenGLFunctions_1_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_1_CoreBackend::versionStatus());
        d_1_1_Core = static_cast<QOpenGLFunctions_1_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_2_CoreBackend::versionStatus());
        d_1_2_Core = static_cast<QOpenGLFunctions_1_2_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_3_CoreBackend::versionStatus());
        d_1_3_Core = static_cast<QOpenGLFunctions_1_3_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_4_CoreBackend::versionStatus());
        d_1_4_Core = static_cast<QOpenGLFunctions_1_4_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_5_CoreBackend::versionStatus());
        d_1_5_Core = static_cast<QOpenGLFunctions_1_5_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_0_DeprecatedBackend::versionStatus());
        d_1_0_Deprecated = static_cast<QOpenGLFunctions_1_0_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_1_DeprecatedBackend::versionStatus());
        d_1_1_Deprecated = static_cast<QOpenGLFunctions_1_1_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_2_DeprecatedBackend::versionStatus());
        d_1_2_Deprecated = static_cast<QOpenGLFunctions_1_2_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_3_DeprecatedBackend::versionStatus());
        d_1_3_Deprecated = static_cast<QOpenGLFunctions_1_3_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_4_DeprecatedBackend::versionStatus());
        d_1_4_Deprecated = static_cast<QOpenGLFunctions_1_4_DeprecatedBackend*>(d);
        d->refs.ref();

        QAbstractOpenGLFunctions::initializeOpenGLFunctions();
    }
    return isInitialized();
}